

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void Imf_3_2::anon_unknown_0::readLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets,bool *complete)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IoExc *this;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t packed_offset;
  ulong local_40;
  uint64_t local_38;
  
  puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar4) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 1;
    do {
      Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,puVar4 + uVar6);
      puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
      bVar1 = uVar8 < uVar5;
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar1);
  }
  *complete = true;
  if (uVar5 != 0) {
    uVar6 = 1;
    uVar8 = 0;
    do {
      uVar7 = uVar6;
      if (puVar4[uVar8] == 0) {
        *complete = false;
        iVar2 = (*is->_vptr_IStream[5])(is);
        if ((lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish !=
            (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start) {
          uVar5 = 0;
          uVar6 = 1;
          do {
            iVar3 = (*is->_vptr_IStream[5])(is);
            (*is->_vptr_IStream[3])(is,&local_38,4);
            Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&local_38);
            Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&local_40);
            if ((0x7fffffffffffffff - local_38 < local_40) ||
               ((local_40 + local_38 & 0xfffffffffffffff8) == 0x7ffffffffffffff8)) {
              this = (IoExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::IoExc::IoExc(this,"Invalid chunk size");
              __cxa_throw(this,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
            }
            Xdr::skip<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,(int)(local_40 + local_38) + 8);
            if (lineOrder == INCREASING_Y) {
              puVar4 = (lineOffsets->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar5;
            }
            else {
              puVar4 = (lineOffsets->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish + ~uVar5;
            }
            *puVar4 = CONCAT44(extraout_var_00,iVar3);
            bVar1 = uVar6 < (ulong)((long)(lineOffsets->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(lineOffsets->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar5 = uVar6;
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (bVar1);
        }
        (*is->_vptr_IStream[7])(is);
        (*is->_vptr_IStream[6])(is,CONCAT44(extraout_var,iVar2));
        return;
      }
      uVar6 = (ulong)((int)uVar7 + 1);
      uVar8 = uVar7;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void
readLineOffsets (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    LineOrder                                lineOrder,
    vector<uint64_t>&                        lineOffsets,
    bool&                                    complete)
{
    for (unsigned int i = 0; i < lineOffsets.size (); i++)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, lineOffsets[i]);
    }

    complete = true;

    for (unsigned int i = 0; i < lineOffsets.size (); i++)
    {
        if (lineOffsets[i] <= 0)
        {
            //
            // Invalid data in the line offset table mean that
            // the file is probably incomplete (the table is
            // the last thing written to the file).  Either
            // some process is still busy writing the file,
            // or writing the file was aborted.
            //
            // We should still be able to read the existing
            // parts of the file.  In order to do this, we
            // have to make a sequential scan over the scan
            // line data to reconstruct the line offset table.
            //

            complete = false;
            reconstructLineOffsets (is, lineOrder, lineOffsets);
            break;
        }
    }
}